

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

void __thiscall FastLinearExpert::modelDisplay(FastLinearExpert *this,ostream *out)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Nu=\n",4);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                 &(this->super_LinearExpert).Nu);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"invSigma=\n",10);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                 &(this->super_LinearExpert).invSigma);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Mu=\n",4);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                 &(this->super_LinearExpert).Mu);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Lambda=\n",8);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                 &(this->super_LinearExpert).Lambda);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Psi=\n",5);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                 &(this->super_LinearExpert).Psi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"H=\n",3);
  poVar1 = std::ostream::_M_insert<double>((this->super_LinearExpert).H);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Sh=\n",4);
  poVar1 = std::ostream::_M_insert<double>((this->super_LinearExpert).Sh);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Sz=\n",4);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                 &(this->super_LinearExpert).Sz);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Sx=\n",4);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                 &(this->super_LinearExpert).Sx);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Sxz=\n",5);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                 &(this->super_LinearExpert).Sxz);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"invSzz=\n",8);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                 &this->invSzz);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"invSzz0=\n",9);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                 &this->invSzz0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"detInvSzz0=\n",0xc);
  poVar1 = std::ostream::_M_insert<double>(this->detInvSzz0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Sxx=\n",5);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                 &(this->super_LinearExpert).Sxx);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Nu0=\n",5);
  poVar1 = Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                 &(this->super_LinearExpert).Nu0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void FAST_LINEAR_EXPERT_base::modelDisplay(std::ostream &out) const
{
    out << EXPAND_N(Nu) << std::endl;
    out << EXPAND_N(invSigma) << std::endl;
    out << EXPAND_N(Mu) << std::endl;
    out << EXPAND_N(Lambda) << std::endl;
    out << EXPAND_N(Psi) << std::endl;

    out << EXPAND_N(H) << std::endl;
    out << EXPAND_N(Sh) << std::endl;
    out << EXPAND_N(Sz) << std::endl;
    out << EXPAND_N(Sx) << std::endl;
    out << EXPAND_N(Sxz) << std::endl;
    out << EXPAND_N(invSzz) << std::endl;
    out << EXPAND_N(invSzz0) << std::endl;
    out << EXPAND_N(detInvSzz0) << std::endl;
    out << EXPAND_N(Sxx) << std::endl;
    out << EXPAND_N(Nu0) << std::endl;
//
//    out << EXPAND(wPsi) << std::endl;
//    out << EXPAND(wNu) << std::endl;
//    out << EXPAND(wSigma) << std::endl;
//    out << EXPAND(wLambda) << std::endl;
//    out << EXPAND(alpha) << std::endl;
//    out << EXPAND(mixture->getPsi()) << std::endl;
//    out << EXPAND(mixture->getSigma()) << std::endl;
}